

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void crnlib::vector<crnlib::optimize_color_params::unpacked_endpoint>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  long lVar1;
  
  for (lVar1 = (ulong)num << 3; lVar1 != 0; lVar1 = lVar1 + -8) {
    optimize_color_params::unpacked_endpoint::unpacked_endpoint
              ((unpacked_endpoint *)pDst_void,(unpacked_endpoint *)pSrc_void);
    pSrc_void = (void *)((long)pSrc_void + 8);
    pDst_void = (void *)((long)pDst_void + 8);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }